

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesDictionary.cpp
# Opt level: O1

void __thiscall
ResourcesDictionary::AddExtGStateMapping
          (ResourcesDictionary *this,ObjectIDType inExtGStateID,string *inExtGStateName)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  undefined1 local_38 [8];
  _Alloc_hider local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  p_Var1 = &(this->mExtGStates)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->mExtGStates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0;
      p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < inExtGStateID]) {
    if (*(ulong *)(p_Var4 + 1) >= inExtGStateID) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var4 = p_Var3, inExtGStateID < *(ulong *)(p_Var3 + 1))) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    std::__cxx11::string::_M_assign((string *)&p_Var4[1]._M_parent);
    return;
  }
  pcVar2 = (inExtGStateName->_M_dataplus)._M_p;
  local_38 = (undefined1  [8])inExtGStateID;
  local_30._M_p = (pointer)&local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar2,pcVar2 + inExtGStateName->_M_string_length);
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
  ::_M_insert_unique<std::pair<unsigned_long_const,std::__cxx11::string>>
            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
              *)&this->mExtGStates,
             (pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_p != &local_20) {
    operator_delete(local_30._M_p,local_20._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ResourcesDictionary::AddExtGStateMapping(ObjectIDType inExtGStateID, const std::string& inExtGStateName)
{
	ObjectIDTypeToStringMap::iterator it = mExtGStates.find(inExtGStateID);

	if(it == mExtGStates.end())
		mExtGStates.insert(ObjectIDTypeToStringMap::value_type(inExtGStateID,inExtGStateName));
	else
		it->second = inExtGStateName;
}